

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

size_t __thiscall llvm::StringRef::find_lower(StringRef *this,char C,size_t From)

{
  char params;
  bool bVar1;
  unsigned_long *puVar2;
  char *pcVar3;
  anon_class_1_1_54a397ec local_179;
  _func_bool_intptr_t_char *local_178;
  intptr_t local_170;
  char local_161;
  size_t sStack_160;
  char L;
  size_t From_local;
  StringRef *pSStack_150;
  char C_local;
  StringRef *this_local;
  undefined1 local_138 [8];
  StringRef S;
  function_ref<bool_(char)> local_118 [2];
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 *local_d0;
  unsigned_long local_c8 [3];
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  ulong local_98;
  StringRef *local_90;
  char *local_88;
  char *local_80;
  StringRef *local_78;
  unsigned_long local_70 [2];
  ulong local_60;
  StringRef *local_58;
  undefined1 local_50 [16];
  undefined1 *local_40;
  char *local_38;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  sStack_160 = From;
  From_local._7_1_ = C;
  pSStack_150 = this;
  local_179.L = toLower(C);
  local_161 = local_179.L;
  function_ref<bool(char)>::function_ref<llvm::StringRef::find_lower(char,unsigned_long)const::__0>
            ((function_ref<bool(char)> *)&local_178,&local_179,(type *)0x0);
  local_118[0].callback = local_178;
  local_118[0].callable = local_170;
  S.Length = sStack_160;
  local_98 = sStack_160;
  local_90 = this;
  local_78 = this;
  if (this->Length < sStack_160) {
    __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                  ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
  }
  local_60 = sStack_160;
  local_70[1] = 0xffffffffffffffff;
  local_58 = this;
  puVar2 = std::min<unsigned_long>(&local_60,&this->Length);
  local_60 = *puVar2;
  pcVar3 = this->Data + local_60;
  local_70[0] = this->Length - local_60;
  puVar2 = std::min<unsigned_long>(local_70 + 1,local_70);
  S.Data = (char *)*puVar2;
  local_28 = local_50;
  local_138 = (undefined1  [8])pcVar3;
  local_88 = pcVar3;
  local_80 = S.Data;
  local_38 = S.Data;
  local_30 = pcVar3;
  while( true ) {
    local_40 = local_138;
    if (S.Data == (char *)0x0) {
      return 0xffffffffffffffff;
    }
    params = front((StringRef *)local_138);
    bVar1 = function_ref<bool_(char)>::operator()(local_118,params);
    if (bVar1) break;
    local_e8 = local_138;
    local_f0 = 1;
    local_d0 = local_e8;
    if (S.Data == (char *)0x0) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x286,"StringRef llvm::StringRef::drop_front(size_t) const");
    }
    local_c8[2] = 1;
    local_c8[1] = 0xffffffffffffffff;
    local_b0 = local_e8;
    puVar2 = std::min<unsigned_long>(local_c8 + 2,(unsigned_long *)&S);
    local_c8[2] = *puVar2;
    pcVar3 = (char *)((long)local_138 + local_c8[2]);
    local_c8[0] = (long)S.Data - local_c8[2];
    puVar2 = std::min<unsigned_long>(local_c8 + 1,local_c8);
    S.Data = (char *)*puVar2;
    local_10 = local_a8;
    local_138 = (undefined1  [8])pcVar3;
    local_20 = S.Data;
    local_18 = pcVar3;
  }
  return this->Length - (long)S.Data;
}

Assistant:

size_t StringRef::find_lower(char C, size_t From) const {
  char L = toLower(C);
  return find_if([L](char D) { return toLower(D) == L; }, From);
}